

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::ExternalCommand::execute
          (ExternalCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          ResultFn *resultFn)

{
  function<void_(llbuild::buildsystem::BuildValue_&&)> *this_00;
  pointer ppBVar1;
  bool bVar2;
  BuildSystemDelegate *pBVar3;
  BuildValue *__args;
  FileSystem *pFVar4;
  undefined8 *puVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  BuildNode *pBVar9;
  char *pcVar10;
  pointer ppBVar11;
  StringRef path;
  StringRef path_00;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  BuildValue result;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> local_58;
  
  pvVar6 = ti.ctx;
  pvVar8 = ti.impl;
  if ((this->skipValue).Storage.hasVal == true) {
    if ((this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
        super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
        super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
        Size != 0) {
      pBVar3 = BuildSystem::getDelegate(system);
      ppBVar11 = (this->super_Command).outputs.
                 super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppBVar11 ==
          (this->super_Command).outputs.
          super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar9 = (BuildNode *)0x0;
      }
      else {
        pBVar9 = *ppBVar11;
      }
      (*pBVar3->_vptr_BuildSystemDelegate[0x10])
                (pBVar3,this,pBVar9,
                 (this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
                 super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
                 super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
                 super_SmallVectorBase.BeginX,
                 (ulong)(this->missingInputKeys).
                        super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
                        super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
                        super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
                        super_SmallVectorBase.Size);
      pBVar3 = BuildSystem::getDelegate(system);
      (*pBVar3->_vptr_BuildSystemDelegate[6])(pBVar3);
    }
    __args = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&this->skipValue);
    std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,__args);
    return;
  }
  if ((this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
      super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
      super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
      Size == 0) {
    pvVar7 = pvVar6;
    if ((this->canUpdateIfNewer == true) && (this->hasPriorResult == true)) {
      pvVar7 = pvVar8;
      (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x1b])
                (&result,this,system,pvVar8,pvVar6);
      bVar2 = canUpdateIfNewerWithResult(this,&result);
      if (bVar2) {
        std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,&result);
        BuildValue::~BuildValue(&result);
        return;
      }
      BuildValue::~BuildValue(&result);
    }
    ppBVar1 = (this->super_Command).outputs.
              super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppBVar11 = (this->super_Command).outputs.
                    super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppBVar11 != ppBVar1;
        ppBVar11 = ppBVar11 + 1) {
      pBVar9 = *ppBVar11;
      if (pBVar9->type != Virtual) {
        path.Length = 2;
        path.Data = (char *)(pBVar9->super_Node).name._M_string_length;
        local_e8 = (_Any_data)
                   llvm::sys::path::parent_path
                             ((path *)(pBVar9->super_Node).name._M_dataplus._M_p,path,(Style)pvVar7)
        ;
        pcVar10 = local_e8._8_8_;
        pvVar7 = (void *)(pBVar9->super_Node).name._M_string_length;
        if ((pvVar7 != (void *)0x0) &&
           (((pBVar9->super_Node).name._M_dataplus._M_p + -1)[(long)pvVar7] == '/')) {
          path_00.Length = 2;
          path_00.Data = pcVar10;
          local_e8 = (_Any_data)
                     llvm::sys::path::parent_path((path *)local_e8._0_8_,path_00,(Style)pvVar7);
          pcVar10 = local_e8._8_8_;
        }
        if (pcVar10 != (char *)0x0) {
          pFVar4 = BuildSystem::getFileSystem(system);
          llvm::StringRef::str_abi_cxx11_((string *)&result,(StringRef *)&local_e8);
          (*pFVar4->_vptr_FileSystem[3])(pFVar4,&result);
          std::__cxx11::string::_M_dispose();
        }
      }
    }
    pBVar3 = BuildSystem::getDelegate(system);
    (*pBVar3->_vptr_BuildSystemDelegate[10])(pBVar3,this);
    this_00 = (function<void_(llbuild::buildsystem::BuildValue_&&)> *)
              ((long)&result.valueData + 0x10);
    result._0_8_ = this;
    result.signature.value = (uint64_t)system;
    result.valueData.asOutputInfo.device = (uint64_t)pvVar8;
    result.valueData.asOutputInfo.inode = (uint64_t)pvVar6;
    std::function<void_(llbuild::buildsystem::BuildValue_&&)>::function(this_00,resultFn);
    local_e8._8_8_ = 0;
    puVar5 = (undefined8 *)operator_new(0x40);
    *puVar5 = result._0_8_;
    puVar5[1] = result.signature.value;
    puVar5[2] = result.valueData.asOutputInfo.device;
    puVar5[3] = result.valueData.asOutputInfo.inode;
    puVar5[4] = 0;
    puVar5[5] = 0;
    puVar5[6] = 0;
    puVar5[7] = result.valueData.asOutputInfo.modTime.nanoseconds;
    if (result.valueData.asOutputInfo.modTime.seconds != 0) {
      puVar5[4] = result.valueData.asOutputInfo.mode;
      puVar5[5] = result.valueData.asOutputInfo.size;
      puVar5[6] = result.valueData.asOutputInfo.modTime.seconds;
      result.valueData.asOutputInfo.modTime.seconds = 0;
      result.valueData.asOutputInfo.modTime.nanoseconds = 0;
    }
    local_e8._M_unused._M_object = puVar5;
    local_d0 = std::
               _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp:426:48)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp:426:48)>
               ::_M_manager;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              (&local_58,(function<void_(llbuild::basic::ProcessResult)> *)&local_e8);
    (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x1a])
              (this,system,pvVar8,pvVar6,context,&local_58);
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::reset(&local_58);
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    if (result.valueData.asOutputInfo.modTime.seconds != 0) {
      (*(code *)result.valueData.asOutputInfo.modTime.seconds)(this_00,this_00,3);
    }
    return;
  }
  __assert_fail("missingInputKeys.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                ,0x189,
                "virtual void llbuild::buildsystem::ExternalCommand::execute(BuildSystem &, core::TaskInterface, QueueJobContext *, ResultFn)"
               );
}

Assistant:

void ExternalCommand::execute(BuildSystem& system,
                              core::TaskInterface ti,
                              QueueJobContext* context,
                              ResultFn resultFn) {
  // If this command should be skipped, do nothing.
  if (skipValue.hasValue()) {
    // If this command had a failed input, treat it as having failed.
    if (!missingInputKeys.empty()) {
      system.getDelegate().commandCannotBuildOutputDueToMissingInputs(this,
                         outputs.empty() ? nullptr : outputs[0], missingInputKeys);

      // Report the command failure.
      system.getDelegate().hadCommandFailure();
    }

    resultFn(std::move(skipValue.getValue()));
    return;
  }
  assert(missingInputKeys.empty());

  // If it is legal to simply update the command, then see if we can do so.
  if (canUpdateIfNewer && hasPriorResult) {
    BuildValue result = computeCommandResult(system, ti);
    if (canUpdateIfNewerWithResult(result)) {
      resultFn(std::move(result));
      return;
    }
  }

  // Create the directories for the directories containing file outputs.
  //
  // FIXME: Implement a shared cache for this, to reduce the number of
  // syscalls required to make this happen.
  for (auto* node: outputs) {
    if (!node->isVirtual()) {
      // Attempt to create the directory; we ignore errors here under the
      // assumption the command will diagnose the situation if necessary.
      //
      // FIXME: Need to use the filesystem interfaces.
      auto parent = llvm::sys::path::parent_path(node->getName());
      if (node->getName().endswith("/")) {
        parent = llvm::sys::path::parent_path(parent);
      }
      if (!parent.empty()) {
        (void) system.getFileSystem().createDirectories(parent);
      }
    }
  }
    
  // Invoke the external command.
  system.getDelegate().commandStarted(this);
  executeExternalCommand(system, ti, context, {[this, &system, ti, resultFn](ProcessResult result) mutable {
    system.getDelegate().commandFinished(this, result.status);

    // Process the result.
    switch (result.status) {
    case ProcessStatus::Failed:
      resultFn(BuildValue::makeFailedCommand());
      return;
    case ProcessStatus::Cancelled:
      resultFn(BuildValue::makeCancelledCommand());
      return;
    case ProcessStatus::Succeeded:
      resultFn(computeCommandResult(system, ti));
      return;
    case ProcessStatus::Skipped:
    case ProcessStatus::Unknown:
      // It is illegal to get skipped result at this point.
      break;
    }
    llvm::report_fatal_error("unknown result");
  }});
}